

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall gutil::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_00124b78;
  std::__cxx11::string::~string((string *)&this->s);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~Exception() throw() { }